

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * google::protobuf::compiler::php::GeneratedMetadataFileName
                   (string *__return_storage_ptr__,string *proto_file,bool is_descriptor)

{
  size_t sVar1;
  pointer pcVar2;
  string *psVar3;
  int iVar4;
  int iVar5;
  string *psVar6;
  size_type *psVar7;
  bool bVar8;
  string result;
  string file_no_suffix;
  string local_d8;
  string local_b8;
  long *local_98 [2];
  long local_88 [2];
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  string *local_58;
  string local_50;
  
  iVar4 = std::__cxx11::string::find_first_of((char *)proto_file,0x35eebe,0);
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"GPBMetadata/","");
  sVar1 = proto_file->_M_string_length;
  if (sVar1 == kEmptyFile_abi_cxx11_._M_string_length) {
    if (sVar1 == 0) {
      psVar7 = &kEmptyMetadataFile_abi_cxx11_._M_string_length;
      psVar6 = &kEmptyMetadataFile_abi_cxx11_;
    }
    else {
      iVar5 = bcmp((proto_file->_M_dataplus)._M_p,kEmptyFile_abi_cxx11_._M_dataplus._M_p,sVar1);
      bVar8 = iVar5 != 0;
      psVar6 = &kDescriptorMetadataFile_abi_cxx11_;
      if (!bVar8) {
        psVar6 = &kEmptyMetadataFile_abi_cxx11_;
      }
      psVar3 = &kDescriptorMetadataFile_abi_cxx11_;
      if (!bVar8) {
        psVar3 = &kEmptyMetadataFile_abi_cxx11_;
      }
      psVar7 = &psVar3->_M_string_length;
      if (bVar8 && !is_descriptor) goto LAB_00237489;
    }
  }
  else {
    if (!is_descriptor) {
LAB_00237489:
      local_78 = &local_68;
      local_70 = 0;
      local_68 = 0;
      std::__cxx11::string::find_last_of((char *)proto_file,0x3605c3,0xffffffffffffffff);
      sVar1 = proto_file->_M_string_length;
      if ((sVar1 == kEmptyFile_abi_cxx11_._M_string_length) &&
         ((sVar1 == 0 ||
          (iVar5 = bcmp((proto_file->_M_dataplus)._M_p,kEmptyFile_abi_cxx11_._M_dataplus._M_p,sVar1)
          , iVar5 == 0)))) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar6 = &kEmptyMetadataFile_abi_cxx11_;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)proto_file);
        std::__cxx11::string::operator=((string *)&local_78,(string *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        local_58 = __return_storage_ptr__;
        if (iVar4 != -1) {
          do {
            std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_78);
            UnderscoresToCamelCase(&local_d8,&local_b8,true);
            std::__cxx11::string::_M_append((char *)local_98,(ulong)local_d8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)local_98);
            iVar4 = std::__cxx11::string::find_first_of
                              ((char *)&local_78,0x35eebe,(long)(iVar4 + 1));
          } while (iVar4 != -1);
        }
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_78);
        UnderscoresToCamelCase(&local_b8,&local_50,true);
        __return_storage_ptr__ = local_58;
        RenameEmpty(&local_d8,&local_b8);
        std::__cxx11::string::_M_append((char *)local_98,(ulong)local_d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        psVar6 = (string *)std::__cxx11::string::append((char *)local_98);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      }
      pcVar2 = (psVar6->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar6->_M_string_length);
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      goto LAB_00237728;
    }
    psVar7 = &kDescriptorMetadataFile_abi_cxx11_._M_string_length;
    psVar6 = &kDescriptorMetadataFile_abi_cxx11_;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + *psVar7);
LAB_00237728:
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedMetadataFileName(const std::string& proto_file,
                                      bool is_descriptor) {
  int start_index = 0;
  int first_index = proto_file.find_first_of("/", start_index);
  std::string result = "GPBMetadata/";

  if (proto_file == kEmptyFile) {
    return kEmptyMetadataFile;
  }
  if (is_descriptor) {
    return kDescriptorMetadataFile;
  }

  // Append directory name.
  std::string file_no_suffix;
  int lastindex = proto_file.find_last_of(".");
  if (proto_file == kEmptyFile) {
    return kEmptyMetadataFile;
  } else {
    file_no_suffix = proto_file.substr(0, lastindex);
  }

  while (first_index != string::npos) {
    result += UnderscoresToCamelCase(
        file_no_suffix.substr(start_index, first_index - start_index), true);
    result += "/";
    start_index = first_index + 1;
    first_index = file_no_suffix.find_first_of("/", start_index);
  }

  // Append file name.
  result += RenameEmpty(UnderscoresToCamelCase(
      file_no_suffix.substr(start_index, first_index - start_index), true));

  return result += ".php";
}